

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O3

void __thiscall FileInputSource::unreadCh(FileInputSource *this,char ch)

{
  pointer pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_30;
  
  iVar2 = ungetc((uint)(byte)ch,(FILE *)this->file);
  if (iVar2 == -1) {
    pcVar1 = (this->filename)._M_dataplus._M_p;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_30,pcVar1,pcVar1 + (this->filename)._M_string_length);
    std::__cxx11::string::append((char *)&local_30);
    QUtil::throw_system_error(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
FileInputSource::unreadCh(char ch)
{
    if (ungetc(static_cast<unsigned char>(ch), this->file) == -1) {
        QUtil::throw_system_error(this->filename + ": unread character");
    }
}